

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascon_aead128.c
# Opt level: O0

void absorb_plaintext(ascon_sponge_t *sponge,uint8_t *ciphertext,uint8_t *plaintext)

{
  uint64_t uVar1;
  uint8_t *in_RDX;
  uint8_t *in_RSI;
  ulong *in_RDI;
  
  uVar1 = bigendian_decode_u64(in_RDX);
  *in_RDI = uVar1 ^ *in_RDI;
  uVar1 = bigendian_decode_u64(in_RDX + 8);
  in_RDI[1] = uVar1 ^ in_RDI[1];
  bigendian_encode_u64(in_RSI,*in_RDI);
  bigendian_encode_u64(in_RSI + 8,in_RDI[1]);
  ascon_permutation_8((ascon_sponge_t *)0x104319);
  return;
}

Assistant:

static void
absorb_plaintext(ascon_sponge_t* const sponge,
                 uint8_t* const ciphertext,
                 const uint8_t* const plaintext)
{
    // Absorb the plaintext.
    sponge->x0 ^= bigendian_decode_u64(plaintext);
    // Squeeze out some ciphertext
    bigendian_encode_u64(ciphertext, sponge->x0);
    // Permute the state
    ascon_permutation_6(sponge);
}